

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QPinchGestureRecognizer::reset(QPinchGestureRecognizer *this,QGesture *state)

{
  long lVar1;
  
  lVar1 = *(long *)&state->field_0x8;
  *(undefined8 *)(lVar1 + 0xa4) = 0;
  *(undefined8 *)(lVar1 + 0xb0) = 0;
  *(undefined8 *)(lVar1 + 0xb8) = 0;
  *(undefined8 *)(lVar1 + 0xc0) = 0;
  *(undefined8 *)(lVar1 + 200) = 0;
  *(undefined8 *)(lVar1 + 0xd0) = 0;
  *(undefined8 *)(lVar1 + 0xd8) = 0;
  *(undefined8 *)(lVar1 + 0xf0) = 0x3ff0000000000000;
  *(undefined8 *)(lVar1 + 0xe0) = 0x3ff0000000000000;
  *(undefined8 *)(lVar1 + 0xe8) = 0x3ff0000000000000;
  *(undefined8 *)(lVar1 + 0xf8) = 0;
  *(undefined8 *)(lVar1 + 0x100) = 0;
  *(undefined8 *)(lVar1 + 0x108) = 0;
  *(undefined1 *)(lVar1 + 0x110) = 1;
  *(undefined8 *)(lVar1 + 0x118) = 0;
  *(undefined8 *)(lVar1 + 0x120) = 0;
  *(undefined8 *)(lVar1 + 0x128) = 0;
  *(undefined8 *)(lVar1 + 0x130) = 0;
  QGestureRecognizer::reset(&this->super_QGestureRecognizer,state);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }